

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BuildValue *rhs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  FileInfo *local_90;
  uint8_t *local_68;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_60;
  ArrayRef<llvm::StringRef> local_48;
  StringList local_38;
  uint local_24;
  FileInfo *pFStack_20;
  uint32_t i;
  FileInfo *newOutputInfos;
  BuildValue *rhs_local;
  BuildValue *this_local;
  
  this->kind = Invalid;
  this->numOutputInfos = rhs->numOutputInfos;
  newOutputInfos = (FileInfo *)rhs;
  rhs_local = this;
  llbuild::basic::CommandSignature::CommandSignature(&this->signature);
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.checksum.bytes[0] = '\0';
  local_68 = (this->valueData).asOutputInfo.checksum.bytes + 1;
  do {
    *local_68 = '\0';
    local_68 = local_68 + 1;
  } while ((StringList *)local_68 != &this->stringValues);
  llbuild::basic::StringList::StringList(&this->stringValues);
  this->kind = (Kind)newOutputInfos->device;
  (this->signature).value = newOutputInfos->inode;
  bVar2 = hasMultipleOutputs((BuildValue *)newOutputInfos);
  if (bVar2) {
    uVar3 = CONCAT44(0,this->numOutputInfos);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x50),0);
    if (SUB168(auVar1 * ZEXT816(0x50),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pFStack_20 = (FileInfo *)operator_new__(uVar4);
    if (uVar3 != 0) {
      local_90 = pFStack_20;
      do {
        llbuild::basic::FileInfo::FileInfo(local_90);
        local_90 = local_90 + 1;
      } while (local_90 != pFStack_20 + uVar3);
    }
    for (local_24 = 0; local_24 < this->numOutputInfos; local_24 = local_24 + 1) {
      memcpy(pFStack_20 + local_24,(void *)(newOutputInfos->mode + (ulong)local_24 * 0x50),0x50);
    }
    (this->valueData).asOutputInfos = pFStack_20;
  }
  else {
    memcpy(&this->valueData,&newOutputInfos->mode,0x50);
  }
  bVar2 = kindHasStringList((BuildValue *)newOutputInfos);
  if (bVar2) {
    llbuild::basic::StringList::getValues(&local_60,(StringList *)&newOutputInfos[1].mode);
    llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>(&local_48,&local_60);
    llbuild::basic::StringList::StringList<llvm::StringRef>(&local_38,local_48);
    llbuild::basic::StringList::operator=(&this->stringValues,&local_38);
    llbuild::basic::StringList::~StringList(&local_38);
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_60);
  }
  return;
}

Assistant:

explicit BuildValue(const BuildValue& rhs) : numOutputInfos(rhs.numOutputInfos) {
    kind = rhs.kind;
    signature = rhs.signature;
    if (rhs.hasMultipleOutputs()) {
      auto newOutputInfos = new FileInfo[numOutputInfos];
      for (uint32_t i = 0; i < numOutputInfos; ++i) {
        newOutputInfos[i] = rhs.valueData.asOutputInfos[i];
      }
      valueData.asOutputInfos = newOutputInfos;
    } else {
      valueData.asOutputInfo = rhs.valueData.asOutputInfo;
    }

    if (rhs.kindHasStringList()) {
      stringValues = basic::StringList(ArrayRef<StringRef>(rhs.stringValues.getValues()));
    }
  }